

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O0

Mat * ncnn::generate_anchors(int base_size,Mat *ratios,Mat *scales)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  Mat *in_RCX;
  Mat *in_RDX;
  int in_ESI;
  Mat *in_RDI;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  float *anchor;
  float rs_h;
  float rs_w;
  float scale;
  int j;
  int r_h;
  int r_w;
  float ar;
  int i;
  float cy;
  float cx;
  int num_scale;
  int num_ratio;
  Mat *anchors;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  Mat *this;
  int local_58;
  int local_48;
  
  iVar1 = in_RDX->w;
  iVar2 = in_RCX->w;
  this = in_RDI;
  Mat::Mat(in_RDI);
  Mat::create(this,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
              (Allocator *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
    pfVar3 = Mat::operator[](in_RDX,(long)local_48);
    fVar5 = *pfVar3;
    fVar4 = (float)in_ESI;
    dVar6 = std::sqrt((double)(ulong)(uint)fVar5);
    dVar6 = std::round((double)(ulong)(uint)(fVar4 / SUB84(dVar6,0)));
    dVar7 = std::round((double)(ulong)(uint)((float)(int)SUB84(dVar6,0) * fVar5));
    for (local_58 = 0; local_58 < iVar2; local_58 = local_58 + 1) {
      pfVar3 = Mat::operator[](in_RCX,(long)local_58);
      fVar5 = (float)(int)SUB84(dVar6,0) * *pfVar3;
      fVar4 = (float)(int)SUB84(dVar7,0) * *pfVar3;
      pfVar3 = Mat::row(in_RDI,local_48 * iVar2 + local_58);
      *pfVar3 = (float)in_ESI * 0.5 - fVar5 * 0.5;
      pfVar3[1] = (float)in_ESI * 0.5 - fVar4 * 0.5;
      pfVar3[2] = (float)in_ESI * 0.5 + fVar5 * 0.5;
      pfVar3[3] = (float)in_ESI * 0.5 + fVar4 * 0.5;
    }
  }
  return this;
}

Assistant:

static Mat generate_anchors(int base_size, const Mat& ratios, const Mat& scales)
{
    int num_ratio = ratios.w;
    int num_scale = scales.w;

    Mat anchors;
    anchors.create(4, num_ratio * num_scale);

    const float cx = base_size * 0.5f;
    const float cy = base_size * 0.5f;

    for (int i = 0; i < num_ratio; i++)
    {
        float ar = ratios[i];

        int r_w = static_cast<int>(round(base_size / sqrt(ar)));
        int r_h = static_cast<int>(round(r_w * ar)); //round(base_size * sqrt(ar));

        for (int j = 0; j < num_scale; j++)
        {
            float scale = scales[j];

            float rs_w = r_w * scale;
            float rs_h = r_h * scale;

            float* anchor = anchors.row(i * num_scale + j);

            anchor[0] = cx - rs_w * 0.5f;
            anchor[1] = cy - rs_h * 0.5f;
            anchor[2] = cx + rs_w * 0.5f;
            anchor[3] = cy + rs_h * 0.5f;
        }
    }

    return anchors;
}